

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O1

void __thiscall KDReports::Test::testHorizForcedBreaking(Test *this)

{
  Data *pDVar1;
  QRect *pQVar2;
  qsizetype qVar3;
  char cVar4;
  int iVar5;
  AutoTableElement *pAVar6;
  longlong __tmp;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QArrayDataPointer<QRect> local_b8;
  Report report;
  char *local_98;
  QArrayDataPointer<QRect> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  QByteArrayView local_28;
  char *local_18;
  
  if (fontFound) {
    fillModel(this,2,10,false);
    KDReports::Report::Report(&report,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)&report);
    pAVar6 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::AutoTableElement::AutoTableElement
              ((AutoTableElement *)&local_88,(QAbstractItemModel *)&this->m_model);
    KDReports::MainTable::setAutoTableElement(pAVar6);
    KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_88);
    KDReports::Report::scaleTo((int)&report,2);
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (QRect *)0x0;
    local_b8.size = 0;
    QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_48,"Noto Sans",9);
    QVar7.m_data = (storage_type *)local_48.d;
    QVar7.m_size = (qsizetype)&local_88;
    QString::fromLatin1(QVar7);
    qVar3 = local_b8.size;
    pQVar2 = local_b8.ptr;
    pDVar1 = local_b8.d;
    local_b8.d = local_88.d;
    local_88.d = pDVar1;
    local_b8.ptr = local_88.ptr;
    local_b8.size = local_88.size;
    local_88.ptr = pQVar2;
    local_88.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    QFont::QFont((QFont *)&local_68,(QString *)&local_b8,0x18,-1,false);
    KDReports::Report::setDefaultFont((QFont *)&report);
    QFont::~QFont((QFont *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    iVar5 = KDReports::Report::numberOfPages();
    cVar4 = QTest::qCompare(iVar5,2,"report.numberOfPages()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0x112);
    if (cVar4 != '\0') {
      KDReports::Report::mainTable();
      local_88.d = (Data *)KDReports::MainTable::lastAutoFontScalingFactor();
      local_b8.d = (Data *)0x3ff0000000000000;
      cVar4 = QTest::qCompare((double *)&local_88,(double *)&local_b8,
                              "report.mainTable()->lastAutoFontScalingFactor()","1.0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                              ,0x113);
      if (cVar4 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        local_b8.d = (Data *)0x0;
        local_b8.ptr = (QRect *)0x0;
        local_b8.size = 0;
        local_48.d = (Data *)0x0;
        local_48.ptr = (char16_t *)0x900000000;
        QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                  ((QMovableArrayOps<QRect> *)&local_b8,0,(QRect *)&local_48);
        local_68.d = (Data *)0x1;
        local_68.ptr = (char16_t *)0x900000001;
        QtPrivate::QMovableArrayOps<QRect>::emplace<QRect>
                  ((QMovableArrayOps<QRect> *)&local_b8,local_b8.size,(QRect *)&local_68);
        QTest::_q_compareSequence<QList<QRect>::const_iterator,QList<QRect>::const_iterator>
                  ((const_iterator)local_88.ptr,local_88.ptr + local_88.size,
                   (const_iterator)local_b8.ptr,local_b8.ptr + local_b8.size,
                   "report.mainTable()->pageRects()",
                   "QList<QRect>() << QRect(0, 0, 1, 10) << QRect(1, 0, 1, 10)",
                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                   ,0x115);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_88);
      }
    }
    KDReports::Report::~Report(&report);
  }
  else {
    local_28.m_size = 0x10c8fb;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_68,(char **)&local_28);
    QVar8.m_data = (storage_type *)local_68.d;
    QVar8.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar8);
    local_48.d = (Data *)local_88.d;
    local_48.ptr = (char16_t *)local_88.ptr;
    local_88.d = (Data *)0x0;
    local_88.ptr = (QRect *)0x0;
    local_48.size = local_88.size;
    local_88.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    local_18 = "Noto Sans";
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_28,&local_18);
    QVar9.m_data = (storage_type *)local_28.m_size;
    QVar9.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar9);
    local_68.d = (Data *)local_88.d;
    local_68.ptr = (char16_t *)local_88.ptr;
    local_88.d = (Data *)0x0;
    local_88.ptr = (QRect *)0x0;
    local_68.size = local_88.size;
    local_88.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    QString::arg((QString *)&local_b8,(int)&local_48,(QChar)(char16_t)&local_68);
    QString::toLatin1_helper_inplace((QString *)&report);
    if (local_98 == (char *)0x0) {
      local_98 = (char *)&QByteArray::_empty;
    }
    QTest::qSkip(local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x109);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&report);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  return;
}

Assistant:

void testHorizForcedBreaking()
    {
        SKIP_IF_FONT_NOT_FOUND

        // There would be room for a single page horizontally, but the user forced 2
        fillModel(2, 10);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(2, 1);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 24));
        QCOMPARE(report.numberOfPages(), 2);
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 1.0);
        // qDebug() << report.mainTable()->pageRects();
        QCOMPARE(report.mainTable()->pageRects(), QList<QRect>() << QRect(0, 0, 1, 10) << QRect(1, 0, 1, 10));
    }